

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O1

sds duckdb_hll::sdscatvprintf(sds s,char *fmt,__va_list_tag *ap)

{
  ulong __size;
  size_t sVar1;
  char *__s;
  sds pcVar2;
  va_list cpy;
  char staticbuf [1024];
  undefined8 local_458;
  void *pvStack_450;
  void *local_448;
  char local_438 [1032];
  
  sVar1 = strlen(fmt);
  __size = sVar1 * 2;
  sVar1 = 0x400;
  __s = local_438;
  if ((__size < 0x401) || (__s = (char *)malloc(__size), sVar1 = __size, __s != (char *)0x0)) {
    do {
      __s[sVar1 - 2] = '\0';
      local_448 = ap->reg_save_area;
      local_458._0_4_ = ap->gp_offset;
      local_458._4_4_ = ap->fp_offset;
      pvStack_450 = ap->overflow_arg_area;
      vsnprintf(__s,sVar1,fmt,&local_458);
      if (__s[sVar1 - 2] == '\0') {
        sVar1 = strlen(__s);
        pcVar2 = sdscatlen(s,__s,sVar1);
        if (__s == local_438) {
          return pcVar2;
        }
        free(__s);
        return pcVar2;
      }
      if (__s != local_438) {
        free(__s);
      }
      sVar1 = sVar1 * 2;
      __s = (char *)malloc(sVar1);
    } while (__s != (char *)0x0);
  }
  return (sds)0x0;
}

Assistant:

sds sdscatvprintf(sds s, const char *fmt, va_list ap) {
    va_list cpy;
    char staticbuf[1024], *buf = staticbuf, *t;
    size_t buflen = strlen(fmt)*2;

    /* We try to start using a static buffer for speed.
     * If not possible we revert to heap allocation. */
    if (buflen > sizeof(staticbuf)) {
        buf = (char*) malloc(buflen);
        if (buf == NULL) return NULL;
    } else {
        buflen = sizeof(staticbuf);
    }

    /* Try with buffers two times bigger every time we fail to
     * fit the string in the current buffer size. */
    while(1) {
        buf[buflen-2] = '\0';
        va_copy(cpy,ap);
        vsnprintf(buf, buflen, fmt, cpy);
        va_end(cpy);
        if (buf[buflen-2] != '\0') {
            if (buf != staticbuf) free(buf);
            buflen *= 2;
            buf = (char*) malloc(buflen);
            if (buf == NULL) return NULL;
            continue;
        }
        break;
    }

    /* Finally concat the obtained string to the SDS string and return it. */
    t = sdscat(s, buf);
    if (buf != staticbuf) free(buf);
    return t;
}